

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O2

int zueci_eci_to_utf8(int eci,uchar *src,int src_len,uint replacement_char,uint flags,uchar *dest,
                     int *p_dest_len)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uchar *dest_00;
  zueci_u32 len;
  int local_68;
  zueci_u32 u;
  uchar replacement [5];
  uint state;
  ulong local_50;
  ulong local_48;
  uchar *local_40;
  zueci_utf8_func_t local_38;
  
  uVar6 = (ulong)replacement_char;
  iVar3 = zueci_is_valid_eci(eci);
  if (iVar3 == 0) {
    return 7;
  }
  if (p_dest_len == (int *)0x0 || (dest == (uchar *)0x0 || src == (uchar *)0x0)) {
    return 8;
  }
  pbVar1 = src + src_len;
  dest_00 = dest;
  local_48 = uVar6;
  if ((eci == 899) ||
     (((flags & 1) != 0 &&
      ((((uint)eci < 0x1c && ((0x800000aU >> (eci & 0x1fU) & 1) != 0)) || (eci == 0xaa)))))) {
    for (; src < pbVar1; src = src + 1) {
      uVar4 = zueci_encode_utf8((uint)*src,dest_00);
      dest_00 = dest_00 + uVar4;
    }
    *p_dest_len = (int)dest_00 - (int)dest;
LAB_001988af:
    iVar3 = 0;
  }
  else {
    if (replacement_char == 0) {
      local_50 = 0;
    }
    else {
      if (0xd7ff < replacement_char && replacement_char - 0x10000 < 0xffffe000) {
        return 8;
      }
      uVar4 = zueci_encode_utf8(replacement_char,replacement);
      local_50 = (ulong)uVar4;
    }
    local_40 = dest;
    if ((eci & 0xfffffffdU) == 1) {
      iVar3 = 0;
      do {
        uVar6 = local_50;
        if (pbVar1 <= src) {
          *p_dest_len = (int)dest - (int)local_40;
          return iVar3;
        }
        if ((char)*src < -0x60) {
          if ((int)local_48 == 0) {
            return 6;
          }
          memcpy(dest,replacement,local_50);
          iVar3 = 1;
        }
        else {
          uVar4 = zueci_encode_utf8((uint)*src,dest);
          uVar6 = (ulong)uVar4;
        }
        dest = dest + uVar6;
        src = src + 1;
      } while( true );
    }
    if (eci == 0xaa) {
      local_38 = zueci_ascii_inv_u;
    }
    else {
      if (eci == 0x1a) {
        if ((int)local_48 != 0) {
          state = 0;
          local_68 = 0;
          do {
            pbVar2 = src;
            if (pbVar1 <= src) {
              *p_dest_len = (int)dest - (int)local_40;
              return local_68;
            }
            do {
              src = pbVar2;
              zueci_decode_utf8(&state,&u,*src);
              uVar6 = local_50;
              if (pbVar1 <= src + 1) {
                if (state == 0) {
LAB_001989d2:
                  uVar4 = zueci_encode_utf8(u,dest);
                  uVar6 = (ulong)uVar4;
                  src = src + 1;
                  goto LAB_001989e4;
                }
                break;
              }
              if (state == 0) goto LAB_001989d2;
              pbVar2 = src + 1;
            } while (state != 0xc);
            if ((char)*src < '\0') {
              src = src + 1;
            }
            memcpy(dest,replacement,local_50);
            state = 0;
            local_68 = 1;
LAB_001989e4:
            dest = dest + uVar6;
          } while( true );
        }
        iVar3 = zueci_is_valid_utf8(src,src_len);
        if (iVar3 == 0) {
          return 9;
        }
        memcpy(dest,src,(long)src_len);
        *p_dest_len = src_len;
        goto LAB_001988af;
      }
      local_38 = zueci_utf8_funcs[eci];
    }
    iVar3 = 0;
    for (; src < pbVar1; src = src + iVar5) {
      len = (int)pbVar1 - (int)src;
      iVar5 = (*local_38)(src,len,flags,&u);
      uVar6 = local_50;
      if (iVar5 == 0) {
        if ((int)local_48 == 0) {
          return 6;
        }
        memcpy(dest,replacement,local_50);
        iVar5 = zueci_replacement_incr(eci,src,len);
        iVar3 = 1;
      }
      else {
        uVar4 = zueci_encode_utf8(u,dest);
        uVar6 = (ulong)uVar4;
      }
      dest = dest + uVar6;
    }
    *p_dest_len = (int)dest - (int)local_40;
  }
  return iVar3;
}

Assistant:

ZUECI_EXTERN int zueci_eci_to_utf8(const int eci, const unsigned char src[], const int src_len,
                    const unsigned int replacement_char, const unsigned int flags, unsigned char dest[],
                    int *p_dest_len) {
    const unsigned char *s = src;
    const unsigned char *const se = src + src_len;
    unsigned char *d = dest;
    zueci_utf8_func_t utf8_func;
    zueci_u32 u;
    int src_incr;
    unsigned char replacement[5];
    int replacement_len = 0; /* g++ complains with "-Wmaybe-uninitialized" if this isn't set */
    int ret = 0;

    if (!zueci_is_valid_eci(eci)) {
        return ZUECI_ERROR_INVALID_ECI;
    }
    if (!src || !dest || !p_dest_len) {
        return ZUECI_ERROR_INVALID_ARGS;
    }

    /* Special case Binary, and if straight-thru flag set then ISO/IEC 8859-1, ASCII and ISO/IEC 646 Invariant also */
    if (eci == 899 || ((flags & ZUECI_FLAG_SB_STRAIGHT_THRU) && (eci == 1 || eci == 3 || eci == 27 || eci == 170))) {
        while (s < se) {
            d += zueci_encode_utf8(*s++, d);
        }
        *p_dest_len = (int) (d - dest);
        return 0;
    }

    if (replacement_char) {
        if (!ZUECI_IS_VALID_UNICODE(replacement_char) || replacement_char > 0xFFFF) { /* Allow BMP only */
            return ZUECI_ERROR_INVALID_ARGS;
        }
        replacement_len = zueci_encode_utf8(replacement_char, replacement);
    }

    /* Special case ISO/IEC 8859-1 */
    if (eci == 1 || eci == 3) {
        for (; s < se; s++) {
            if (*s >= 0x80 && *s < 0xA0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_DATA;
                }
                memcpy(d, replacement, replacement_len);
                d += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
            } else {
                d += zueci_encode_utf8(*s, d);
            }
        }
        *p_dest_len = (int) (d - dest);
        return ret;
    }

    /* Special case UTF-8 */
    if (eci == 26) {
        if (replacement_char) {
            unsigned int state = 0;
            while (s < se) {
                do {
                    zueci_decode_utf8(&state, &u, *s++);
                } while (s < se && state != 0 && state != 12);
                if (state != 0) {
                    if (*(s - 1) < 0x80) { /* If previous ASCII, backtrack */
                        s--;
                    } else {
                        while (s < se && (*s & 0xC0) == 0x80) { /* Skip any continuation bytes */
                            s++;
                        }
                    }
                    memcpy(d, replacement, replacement_len);
                    d += replacement_len;
                    ret = ZUECI_WARN_INVALID_DATA;
                    state = 0;
                } else {
                    d += zueci_encode_utf8(u, d);
                }
            }
            *p_dest_len = (int) (d - dest);
            return ret;
        }
        if (!zueci_is_valid_utf8(src, src_len)) {
            return ZUECI_ERROR_INVALID_UTF8;
        }
        memcpy(dest, src, src_len);
        *p_dest_len = src_len;
        return 0;
    }

    if (eci == 170) {
        utf8_func = zueci_ascii_inv_u;
    } else {
        utf8_func = zueci_utf8_funcs[eci];
    }

    while (s < se) {
        if (!(src_incr = (*utf8_func)(s, (int) (se - s), flags, &u))) {
            if (!replacement_char) {
                return ZUECI_ERROR_INVALID_DATA;
            }
            memcpy(d, replacement, replacement_len);
            s += zueci_replacement_incr(eci, s, (int) (se - s));
            d += replacement_len;
            ret = ZUECI_WARN_INVALID_DATA;
        } else {
            s += src_incr;
            d += zueci_encode_utf8(u, d);
        }
    }
    *p_dest_len = (int) (d - dest);
    return ret;
}